

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataManMonitor.cpp
# Opt level: O2

void __thiscall adios2::core::engine::DataManMonitor::BeginStep(DataManMonitor *this,size_t step)

{
  duration in_RAX;
  rep rVar1;
  _Elt_pointer puVar2;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_18;
  
  local_18.__d.__r = (duration)(duration)in_RAX.__r;
  if (step == 0) {
    rVar1 = std::chrono::_V2::system_clock::now();
    (this->m_InitialTimer).__d.__r = rVar1;
  }
  if ((this->m_StepTimers).c.
      super__Deque_base<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      (this->m_StepTimers).c.
      super__Deque_base<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    local_18.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    std::
    deque<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::allocator<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>>
    ::
    emplace_back<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
              ((deque<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::allocator<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>>
                *)&this->m_StepTimers,&local_18);
  }
  this->m_StepBytes = 0;
  puVar2 = (this->m_TotalBytes).c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (puVar2 == (this->m_TotalBytes).c.
                super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Deque_impl_data._M_start._M_cur) {
    local_18.__d.__r = (duration)0;
    std::deque<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
              (&(this->m_TotalBytes).c,(unsigned_long *)&local_18);
  }
  else {
    if (puVar2 == (this->m_TotalBytes).c.
                  super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_first) {
      puVar2 = (this->m_TotalBytes).c.
               super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    std::deque<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (&(this->m_TotalBytes).c,puVar2 + -1);
  }
  this->m_CurrentStep = this->m_CurrentStep + 1;
  return;
}

Assistant:

void DataManMonitor::BeginStep(const size_t step)
{
    if (step == 0)
    {
        m_InitialTimer = std::chrono::system_clock::now();
    }
    if (m_StepTimers.empty())
    {
        m_StepTimers.push(std::chrono::system_clock::now());
    }

    m_StepBytes = 0;

    if (m_TotalBytes.empty())
    {
        m_TotalBytes.push(0);
    }
    else
    {
        m_TotalBytes.push(m_TotalBytes.back());
    }

    ++m_CurrentStep;
}